

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O1

void __thiscall CMU462::MeshResampler::resample(MeshResampler *this,HalfedgeMesh *mesh)

{
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *plVar1;
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar2;
  size_t sVar3;
  double dVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  _List_node_base *p_Var8;
  int iVar9;
  int iVar10;
  int iVar11;
  _List_node_base *p_Var12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  _List_node_base *p_Var17;
  int iVar18;
  EdgeIter EVar19;
  EdgeIter EVar20;
  _Self __tmp;
  int iVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  Vector3D N;
  Vector3D c;
  double local_80;
  Vector3D local_60;
  double local_48;
  double dStack_40;
  double local_38;
  
  plVar1 = &mesh->edges;
  p_Var8 = (mesh->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  local_80 = 0.0;
  if (p_Var8 != (_List_node_base *)plVar1) {
    local_80 = 0.0;
    do {
      p_Var17 = p_Var8[6]._M_prev[2]._M_prev;
      p_Var12 = p_Var8[6]._M_prev[1]._M_prev[2]._M_prev;
      dVar22 = (double)p_Var12[1]._M_prev - (double)p_Var17[1]._M_prev;
      dVar23 = (double)p_Var12[2]._M_next - (double)p_Var17[2]._M_next;
      dVar4 = (double)p_Var12[2]._M_prev - (double)p_Var17[2]._M_prev;
      dVar4 = dVar4 * dVar4 + dVar22 * dVar22 + dVar23 * dVar23;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      local_80 = local_80 + dVar4;
      p_Var8 = p_Var8->_M_next;
    } while (p_Var8 != (_List_node_base *)plVar1);
  }
  sVar3 = (mesh->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
          _M_node._M_size;
  dVar4 = (local_80 /
          (((double)CONCAT44(0x45300000,(int)(sVar3 >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0))) * 4.0;
  plVar2 = &mesh->vertices;
  iVar7 = 0;
  do {
    iVar21 = (int)(mesh->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>.
                  _M_impl._M_node._M_size;
    EVar19._M_node = (_List_node_base *)plVar1;
    if (0 < iVar21) {
      do {
        EVar19._M_node = (EVar19._M_node)->_M_next;
        p_Var8 = EVar19._M_node[6]._M_prev[2]._M_prev;
        p_Var17 = EVar19._M_node[6]._M_prev[1]._M_prev[2]._M_prev;
        dVar23 = (double)p_Var17[1]._M_prev - (double)p_Var8[1]._M_prev;
        dVar24 = (double)p_Var17[2]._M_next - (double)p_Var8[2]._M_next;
        dVar22 = (double)p_Var17[2]._M_prev - (double)p_Var8[2]._M_prev;
        dVar22 = dVar22 * dVar22 + dVar23 * dVar23 + dVar24 * dVar24;
        if (dVar22 < 0.0) {
          dVar22 = sqrt(dVar22);
        }
        else {
          dVar22 = SQRT(dVar22);
        }
        if (dVar4 / 3.0 < dVar22) {
          HalfedgeMesh::splitEdge(mesh,EVar19);
        }
        iVar21 = iVar21 + -1;
      } while (iVar21 != 0);
    }
    bVar6 = true;
    EVar19._M_node =
         (plVar1->super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>)._M_impl._M_node.
         super__List_node_base._M_next;
    do {
      p_Var8 = EVar19._M_node[6]._M_prev[2]._M_prev;
      p_Var17 = EVar19._M_node[6]._M_prev[1]._M_prev[2]._M_prev;
      dVar23 = (double)p_Var17[1]._M_prev - (double)p_Var8[1]._M_prev;
      dVar24 = (double)p_Var17[2]._M_next - (double)p_Var8[2]._M_next;
      dVar22 = (double)p_Var17[2]._M_prev - (double)p_Var8[2]._M_prev;
      dVar22 = dVar22 * dVar22 + dVar23 * dVar23 + dVar24 * dVar24;
      if (dVar22 < 0.0) {
        dVar22 = sqrt(dVar22);
      }
      else {
        dVar22 = SQRT(dVar22);
      }
      if (dVar4 / 5.0 <= dVar22) {
        EVar20._M_node = (EVar19._M_node)->_M_next;
        if (EVar20._M_node == (_List_node_base *)plVar1) {
          bVar6 = false;
        }
      }
      else {
        EVar20._M_node = EVar19._M_node;
        do {
          do {
            EVar20._M_node = (EVar20._M_node)->_M_next;
          } while (EVar20._M_node == EVar19._M_node[6]._M_prev[2]._M_next[2]._M_next[3]._M_next);
        } while (EVar20._M_node ==
                 EVar19._M_node[6]._M_prev[1]._M_prev[2]._M_next[2]._M_next[3]._M_next);
        if (EVar20._M_node == (_List_node_base *)plVar1) {
          bVar6 = false;
        }
        HalfedgeMesh::collapseEdge(mesh,EVar19);
      }
      EVar19._M_node = EVar20._M_node;
    } while (bVar6);
    for (EVar19._M_node =
              (plVar1->super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>)._M_impl.
              _M_node.super__List_node_base._M_next; EVar19._M_node != (_List_node_base *)plVar1;
        EVar19._M_node = (EVar19._M_node)->_M_next) {
      p_Var8 = EVar19._M_node[6]._M_prev;
      p_Var17 = p_Var8[2]._M_prev[0xf]._M_prev;
      iVar21 = 0;
      p_Var12 = p_Var17;
      do {
        iVar21 = iVar21 + (*(byte *)&p_Var12[3]._M_prev[0xc]._M_next ^ 1);
        p_Var12 = p_Var12[1]._M_prev[2]._M_next;
      } while (p_Var17 != p_Var12);
      p_Var17 = p_Var8[1]._M_prev[2]._M_prev[0xf]._M_prev;
      iVar9 = 0;
      p_Var12 = p_Var17;
      do {
        iVar9 = iVar9 + (*(byte *)&p_Var12[3]._M_prev[0xc]._M_next ^ 1);
        p_Var12 = p_Var12[1]._M_prev[2]._M_next;
      } while (p_Var17 != p_Var12);
      p_Var17 = p_Var8[2]._M_next[2]._M_next[2]._M_prev[0xf]._M_prev;
      iVar10 = 0;
      p_Var12 = p_Var17;
      do {
        iVar10 = iVar10 + (*(byte *)&p_Var12[3]._M_prev[0xc]._M_next ^ 1);
        p_Var12 = p_Var12[1]._M_prev[2]._M_next;
      } while (p_Var17 != p_Var12);
      p_Var8 = p_Var8[1]._M_prev[2]._M_next[2]._M_next[2]._M_prev[0xf]._M_prev;
      iVar11 = 0;
      p_Var17 = p_Var8;
      do {
        iVar11 = iVar11 + (*(byte *)&p_Var17[3]._M_prev[0xc]._M_next ^ 1);
        p_Var17 = p_Var17[1]._M_prev[2]._M_next;
      } while (p_Var8 != p_Var17);
      iVar13 = iVar21 + -6;
      iVar5 = -iVar13;
      if (0 < iVar13) {
        iVar5 = iVar13;
      }
      iVar14 = iVar9 + -6;
      iVar13 = -iVar14;
      if (0 < iVar14) {
        iVar13 = iVar14;
      }
      iVar15 = iVar10 + -6;
      iVar14 = -iVar15;
      if (0 < iVar15) {
        iVar14 = iVar15;
      }
      iVar18 = iVar11 + -6;
      iVar15 = -iVar18;
      if (0 < iVar18) {
        iVar15 = iVar18;
      }
      uVar16 = iVar15 + iVar14 + iVar13 + iVar5;
      iVar21 = iVar21 + -7;
      iVar5 = -iVar21;
      if (0 < iVar21) {
        iVar5 = iVar21;
      }
      iVar9 = iVar9 + -7;
      iVar21 = -iVar9;
      if (0 < iVar9) {
        iVar21 = iVar9;
      }
      iVar10 = iVar10 + -5;
      iVar9 = -iVar10;
      if (0 < iVar10) {
        iVar9 = iVar10;
      }
      iVar11 = iVar11 + -5;
      iVar10 = -iVar11;
      if (0 < iVar11) {
        iVar10 = iVar11;
      }
      if ((uint)(iVar10 + iVar9 + iVar21 + iVar5) < uVar16) {
        HalfedgeMesh::flipEdge((HalfedgeMesh *)(ulong)uVar16,EVar19);
      }
    }
    for (p_Var8 = (plVar2->super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>).
                  _M_impl._M_node.super__List_node_base._M_next; p_Var8 != (_List_node_base *)plVar2
        ; p_Var8 = p_Var8->_M_next) {
      Vertex::normal(&local_60,(Vertex *)(p_Var8 + 1));
      (*(code *)(p_Var8[1]._M_next)->_M_next)(&local_48,(Vertex *)(p_Var8 + 1));
      p_Var17 = p_Var8[2]._M_prev;
      dVar22 = local_38 - (double)p_Var17;
      p_Var12 = p_Var8[2]._M_next;
      dVar23 = local_48 - (double)p_Var8[1]._M_prev;
      dVar24 = dStack_40 - (double)p_Var12;
      dVar25 = local_60.z * dVar22 + local_60.x * dVar23 + dVar24 * local_60.y;
      p_Var8[4]._M_prev = (_List_node_base *)((dVar23 - dVar25) * 0.2 + (double)p_Var8[1]._M_prev);
      p_Var8[5]._M_next = (_List_node_base *)((dVar24 - dVar25) * 0.2 + (double)p_Var12);
      p_Var8[5]._M_prev = (_List_node_base *)((dVar22 - dVar25) * 0.2 + (double)p_Var17);
    }
    for (p_Var8 = (plVar2->super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>).
                  _M_impl._M_node.super__List_node_base._M_next; p_Var8 != (_List_node_base *)plVar2
        ; p_Var8 = p_Var8->_M_next) {
      p_Var8[2]._M_prev = p_Var8[5]._M_prev;
      p_Var17 = p_Var8[5]._M_next;
      p_Var8[1]._M_prev = p_Var8[4]._M_prev;
      p_Var8[2]._M_next = p_Var17;
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 5);
  return;
}

Assistant:

void MeshResampler::resample(HalfedgeMesh& mesh) {
	// TODO: (meshEdit)
	// Compute the mean edge length.
	double L = 0.0;
	for (EdgeIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++) {
		L += e->length();
	}
	L /= mesh.nEdges();

	// Repeat the four main steps for 5 or 6 iterations
	for (int i = 0; i < 5; i++) {
		// -> Split edges much longer than the target length (being careful about
		//    how the loop is written!)
		int n = mesh.nEdges();
		EdgeIter e = mesh.edgesBegin();
		for (int i = 0; i < n; i++) {
			if (e->length() > 4.0*L / 3.0) mesh.splitEdge(e);
			e++;
		}
		/*EdgeIter e_start = mesh.edgesBegin();
		EdgeIter e_end = mesh.edgesEnd();
		for (EdgeIter e = e_start; e != e_end; e++) {
			if (e->length() > 4.0*L / 3.0) mesh.splitEdge(e);
		}*/

		// -> Collapse edges much shorter than the target length.  Here we need to
		//    be EXTRA careful about advancing the loop, because many edges may have
		//    been destroyed by a collapse (which ones?)
		e = mesh.edgesBegin();
		//EdgeIter e = mesh.edgesBegin();
		EdgeIter e_next = e;
		bool keep_going = true;
		while (keep_going){
			if (e->length() < 4.0*L / 5.0) {
				HalfedgeIter halfedge1 = e->halfedge();
				HalfedgeIter halfedge2 = e->halfedge()->twin();
				EdgeIter deleted_edge_1 = halfedge1->next()->next()->edge();
				EdgeIter deleted_edge_2 = halfedge2->next()->next()->edge();

				e_next = e;
				e_next++;
				while (e_next == deleted_edge_1 || e_next == deleted_edge_2) e_next++;
				if (e_next == mesh.edgesEnd()) keep_going = false;
				mesh.collapseEdge(e);
				e = e_next;
			}
			else {
				e++;
				if (e == mesh.edgesEnd()) keep_going = false;
			}
		}

		/*vector<EdgeIter> buffer;
		for (EdgeIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++) {
			if (e->length() < 4.0*L / 5.0) buffer.push_back(e); 
		}
		for (EdgeIter e: buffer) mesh.collapseEdge(e);*/

		/*EdgeIter e = mesh.edgesBegin();
		EdgeIter e_next = e;
		for (int i = 0; i < mesh.nEdges();i++) {
			e_next++;
			if (e->length() < 4.0*L / 5.0) mesh.collapseEdge(e);
			e = e_next;
		}*/

		// -> Now flip each edge if it improves vertex degree
		for (EdgeIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++) {
			int a1 = e->halfedge()->vertex()->degree();
			int a2 = e->halfedge()->twin()->vertex()->degree();
			int b1 = e->halfedge()->next()->next()->vertex()->degree();
			int b2 = e->halfedge()->twin()->next()->next()->vertex()->degree();
			int before = abs(a1 - 6) + abs(a2 - 6) + abs(b1 - 6) + abs(b2 - 6);
			int after = abs(a1 - 1 - 6) + abs(a2 - 1 - 6) + abs(b1 + 1 - 6) + abs(b2 + 1 - 6);
			if (after < before) mesh.flipEdge(e);
		}

		// -> Finally, apply some tangential smoothing to the vertex positions
		for (VertexIter ver = mesh.verticesBegin(); ver != mesh.verticesEnd(); ver++) {
			double w = 1.0 / 5.0;
			Vector3D N = ver->normal();
			Vector3D c = ver->centroid();
			Vector3D p = ver->position;
			Vector3D v = c - p;
			v = v - dot(N, v);
			ver->newPosition = p + w * v;
		}
		for (VertexIter ver = mesh.verticesBegin(); ver != mesh.verticesEnd(); ver++) {
			ver->position = ver->newPosition;
		}

	}
	//showError("resample() not implemented.");
}